

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  uint n;
  REF_GRID pRVar2;
  uint uVar3;
  int iVar4;
  void *data;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  REF_MPI pRVar8;
  char *pcVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  REF_DBL *pRVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  REF_INT nterm;
  REF_INT local;
  REF_INT file_nnode;
  uint local_7c;
  FILE *local_78;
  int local_64;
  int local_60;
  int local_5c;
  long local_58;
  ulong local_50;
  REF_DBL *local_48;
  ulong local_40;
  REF_GRID local_38;
  long lVar16;
  
  ref_node = ref_grid->node;
  lVar11 = ref_node->old_n_global;
  lVar7 = lVar11 / 2;
  pRVar8 = ref_grid->mpi;
  if (pRVar8->id == 0) {
    local_78 = fopen(filename,"r");
    if (local_78 == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      pcVar9 = "unable to open file";
      uVar6 = 0x8c9;
      goto LAB_001c2b3b;
    }
    iVar4 = __isoc99_fscanf(local_78,"%d %d",&local_5c,&local_64);
    if (iVar4 != 2) {
      lVar12 = (long)iVar4;
      pcVar9 = "read header";
      lVar7 = 2;
      uVar6 = 0x8ca;
      goto LAB_001c2c3c;
    }
    lVar12 = (long)local_5c;
    if (lVar7 != lVar12) {
      pcVar9 = "wrong node count";
      uVar6 = 0x8cb;
      goto LAB_001c2c3c;
    }
    lVar12 = (long)local_64;
    if (lVar12 != 3) {
      pcVar9 = "expected 3 term 2x2 anisotropic M";
      lVar7 = 3;
      uVar6 = 0x8cc;
      goto LAB_001c2c3c;
    }
    pRVar8 = ref_grid->mpi;
  }
  else {
    local_78 = (FILE *)0x0;
  }
  auVar1._8_8_ = lVar11 - (lVar11 >> 0x3f) >> 0x3f;
  auVar1._0_8_ = lVar7;
  auVar1 = auVar1 / SEXT816((long)pRVar8->n);
  lVar12 = (long)auVar1._0_4_;
  if (auVar1._0_8_ < 100000) {
    lVar12 = 100000;
  }
  if (lVar7 <= lVar12) {
    lVar12 = lVar7;
  }
  uVar3 = (uint)lVar12;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8d2,
           "ref_part_bamg_metric","malloc metric of REF_DBL negative");
    return 1;
  }
  n = uVar3 * 3;
  data = malloc((ulong)n << 3);
  auVar1 = _DAT_002117f0;
  if (data != (void *)0x0) {
    if (uVar3 != 0) {
      uVar5 = 1;
      if (1 < (int)n) {
        uVar5 = (ulong)n;
      }
      lVar12 = uVar5 - 1;
      auVar14._8_4_ = (int)lVar12;
      auVar14._0_8_ = lVar12;
      auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
      lVar12 = 0;
      auVar14 = auVar14 ^ _DAT_002117f0;
      auVar15 = _DAT_002117e0;
      do {
        auVar17 = auVar15 ^ auVar1;
        if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                    auVar14._4_4_ < auVar17._4_4_) & 1)) {
          *(undefined8 *)((long)data + lVar12) = 0xbff0000000000000;
        }
        if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
            auVar17._12_4_ <= auVar14._12_4_) {
          *(undefined8 *)((long)data + lVar12 + 8) = 0xbff0000000000000;
        }
        lVar16 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar16 + 2;
        lVar12 = lVar12 + 0x10;
      } while ((ulong)((int)uVar5 + 1U & 0xfffffffe) << 3 != lVar12);
    }
    if (1 < lVar11) {
      local_40 = (ulong)(uVar3 & 0x7fffffff);
      local_48 = (REF_DBL *)((long)data + 0x10);
      local_7c = 1;
      lVar11 = 0;
      local_38 = ref_grid;
      do {
        pRVar2 = local_38;
        local_50 = ref_node->old_n_global - lVar11;
        if ((long)local_40 < (long)local_50) {
          local_50 = local_40;
        }
        pRVar8 = local_38->mpi;
        local_58 = lVar11;
        if (pRVar8->id == 0) {
          if (0 < (int)(uint)local_50) {
            lVar11 = -(ulong)((uint)local_50 & 0x7fffffff);
            pvVar10 = data;
            do {
              iVar4 = __isoc99_fscanf(local_78,"%lf %lf %lf",pvVar10,(long)pvVar10 + 8,
                                      (long)pvVar10 + 0x10);
              if (iVar4 != 3) {
                lVar12 = (long)iVar4;
                pcVar9 = "metric read error";
                lVar7 = 3;
                uVar6 = 0x8dd;
                goto LAB_001c2c3c;
              }
              pvVar10 = (void *)((long)pvVar10 + 0x18);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0);
            pRVar8 = pRVar2->mpi;
          }
          lVar11 = local_58;
          uVar3 = ref_mpi_bcast(pRVar8,data,n,3);
          if (uVar3 != 0) {
            pcVar9 = "bcast";
            uVar6 = 0x8e1;
            goto LAB_001c2bce;
          }
        }
        else {
          uVar3 = ref_mpi_bcast(pRVar8,data,n,3);
          if (uVar3 != 0) {
            pcVar9 = "bcast";
            uVar6 = 0x8e5;
LAB_001c2bce:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar6,"ref_part_bamg_metric",(ulong)uVar3,pcVar9);
            return uVar3;
          }
        }
        if (0 < (int)(uint)local_50) {
          lVar12 = -(ulong)((uint)local_50 & 0x7fffffff);
          pRVar13 = local_48;
          do {
            uVar3 = ref_node_local(ref_node,lVar11,&local_60);
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x8e9,"ref_part_bamg_metric",(ulong)uVar3,"local");
              local_7c = uVar3;
            }
            if ((uVar3 != 5) && (uVar3 != 0)) {
              return local_7c;
            }
            if ((local_60 != -1) &&
               (uVar3 = ref_node_metric_form
                                  (ref_node,local_60,pRVar13[-2],pRVar13[-1],0.0,*pRVar13,0.0,1.0),
               uVar3 != 0)) {
              pcVar9 = "set local node met";
              uVar6 = 0x8ee;
              goto LAB_001c2bce;
            }
            pRVar13 = pRVar13 + 3;
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0);
        }
        lVar11 = local_58 + (int)local_50;
      } while (lVar11 < lVar7);
      pRVar8 = local_38->mpi;
    }
    free(data);
    if (pRVar8->id != 0) {
      return 0;
    }
    iVar4 = fclose(local_78);
    if (iVar4 == 0) {
      return 0;
    }
    lVar12 = (long)iVar4;
    pcVar9 = "close file";
    uVar6 = 0x8f5;
    lVar7 = 0;
LAB_001c2c3c:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar6,
           "ref_part_bamg_metric",pcVar9,lVar7,lVar12);
    return 1;
  }
  pcVar9 = "malloc metric of REF_DBL NULL";
  uVar6 = 0x8d2;
LAB_001c2b3b:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar6,
         "ref_part_bamg_metric",pcVar9);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_part_bamg_metric(REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT chunk;
  REF_DBL *metric;
  REF_INT file_nnode, section_size;
  REF_GLOB nnode, nnode_read, global;
  REF_INT node, local;
  REF_INT nterm;

  nnode = ref_node_n_global(ref_node) / 2;

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    REIS(2, fscanf(file, "%d %d", &file_nnode, &nterm), "read header");
    REIS(nnode, file_nnode, "wrong node count");
    REIS(3, nterm, "expected 3 term 2x2 anisotropic M");
  }

  chunk = (REF_INT)MAX(100000, nnode / ref_mpi_n(ref_grid_mpi(ref_grid)));
  chunk = (REF_INT)MIN((REF_GLOB)chunk, nnode);

  ref_malloc_init(metric, 3 * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size =
        (REF_INT)MIN((REF_GLOB)chunk, ref_node_n_global(ref_node) - nnode_read);
    if (ref_grid_once(ref_grid)) {
      for (node = 0; node < section_size; node++) {
        REIS(3,
             fscanf(file, "%lf %lf %lf", &(metric[0 + 3 * node]),
                    &(metric[1 + 3 * node]), &(metric[2 + 3 * node])),
             "metric read error");
      }
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), metric, 3 * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        RSS(ref_node_metric_form(ref_node, local, metric[0 + 3 * node],
                                 metric[1 + 3 * node], 0, metric[2 + 3 * node],
                                 0, 1),
            "set local node met");
      }
    }
    nnode_read += section_size;
  }

  ref_free(metric);
  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  return REF_SUCCESS;
}